

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTimer.h
# Opt level: O0

void __thiscall HighsTimer::HighsTimer(HighsTimer *this)

{
  HighsInt HVar1;
  undefined8 *in_RDI;
  char *in_stack_00000008;
  HighsTimer *in_stack_00000010;
  HighsInt i_clock;
  
  *in_RDI = &PTR__HighsTimer_0096d7a0;
  in_RDI[1] = 0x3ff0000000000000;
  *(undefined4 *)(in_RDI + 2) = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x49b224);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49b237);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x49b24a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x49b25d);
  *(undefined4 *)(in_RDI + 2) = 0;
  clock_def(in_stack_00000010,in_stack_00000008);
  HVar1 = clock_def(in_stack_00000010,in_stack_00000008);
  *(HighsInt *)(in_RDI + 0xf) = HVar1;
  HVar1 = clock_def(in_stack_00000010,in_stack_00000008);
  *(HighsInt *)((long)in_RDI + 0x7c) = HVar1;
  HVar1 = clock_def(in_stack_00000010,in_stack_00000008);
  *(HighsInt *)(in_RDI + 0x10) = HVar1;
  return;
}

Assistant:

HighsTimer() {
    num_clock = 0;
    HighsInt i_clock = clock_def("Run HiGHS");
    assert(i_clock == 0);

    presolve_clock = clock_def("Presolve");
    solve_clock = clock_def("Solve");
    postsolve_clock = clock_def("Postsolve");
  }